

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool google::protobuf::util::FieldMaskUtil::TrimMessage
               (FieldMask *mask,Message *message,TrimOptions *options)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Descriptor *node;
  Message *message_00;
  Descriptor *descriptor;
  undefined1 local_48 [8];
  FieldMaskTree tree;
  
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tree;
  tree.root_.children._M_t._M_impl._0_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  anon_unknown_0::FieldMaskTree::MergeFromFieldMask((FieldMaskTree *)local_48,mask);
  if (*options == (TrimOptions)0x1) {
    iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
    node = protobuf::internal::CheckNotNull<google::protobuf::Descriptor_const>
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/field_mask_util.cc"
                      ,0x2c9,"\'message->GetDescriptor()\' must not be nullptr",
                      (Descriptor *)CONCAT44(extraout_var,iVar2));
    if (tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0)
    {
      anon_unknown_0::FieldMaskTree::AddRequiredFieldPath
                ((FieldMaskTree *)local_48,(Node *)node,descriptor);
    }
  }
  message_00 = protobuf::internal::CheckNotNull<google::protobuf::Message>
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/field_mask_util.cc"
                          ,0x2cb,"\'message\' must not be nullptr",message);
  bVar1 = anon_unknown_0::FieldMaskTree::TrimMessage((FieldMaskTree *)local_48,message_00);
  anon_unknown_0::FieldMaskTree::Node::~Node((Node *)local_48);
  return bVar1;
}

Assistant:

bool FieldMaskUtil::TrimMessage(const FieldMask& mask, Message* message,
                                const TrimOptions& options) {
  // Build a FieldMaskTree and walk through the tree to merge all specified
  // fields.
  FieldMaskTree tree;
  tree.MergeFromFieldMask(mask);
  // If keep_required_fields is true, implicitely add required fields of
  // a message present in the tree to prevent from trimming.
  if (options.keep_required_fields()) {
    tree.AddRequiredFieldPath(GOOGLE_CHECK_NOTNULL(message->GetDescriptor()));
  }
  return tree.TrimMessage(GOOGLE_CHECK_NOTNULL(message));
}